

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::translate(btSoftBody *this,btVector3 *trs)

{
  btTransform t;
  btTransform local_40;
  
  local_40.m_basis.m_el[0].m_floats[0] = 1.0;
  local_40.m_basis.m_el[0].m_floats[1] = 0.0;
  local_40.m_basis.m_el[0].m_floats[2] = 0.0;
  local_40.m_basis.m_el[0].m_floats[3] = 0.0;
  local_40.m_basis.m_el[1].m_floats[0] = 0.0;
  local_40.m_basis.m_el[1].m_floats[1] = 1.0;
  local_40.m_basis.m_el[1].m_floats[2] = 0.0;
  local_40.m_basis.m_el[1].m_floats[3] = 0.0;
  local_40.m_basis.m_el[2].m_floats[0] = 0.0;
  local_40.m_basis.m_el[2].m_floats[1] = 0.0;
  local_40.m_basis.m_el[2].m_floats[2] = 1.0;
  local_40.m_basis.m_el[2].m_floats[3] = 0.0;
  local_40.m_origin.m_floats[0] = (btScalar)*(undefined8 *)trs->m_floats;
  local_40.m_origin.m_floats[1] = (btScalar)((ulong)*(undefined8 *)trs->m_floats >> 0x20);
  local_40.m_origin.m_floats[2] = (btScalar)*(undefined8 *)(trs->m_floats + 2);
  local_40.m_origin.m_floats[3] = (btScalar)((ulong)*(undefined8 *)(trs->m_floats + 2) >> 0x20);
  transform(this,&local_40);
  return;
}

Assistant:

void			btSoftBody::translate(const btVector3& trs)
{
	btTransform	t;
	t.setIdentity();
	t.setOrigin(trs);
	transform(t);
}